

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  undefined8 *puVar2;
  undefined1 n [16];
  format_specs specs;
  num_writer f;
  bool bVar3;
  char cVar4;
  bool bVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  undefined8 uVar12;
  reference pcVar13;
  undefined8 uVar14;
  char *pcVar15;
  long *in_RDI;
  string_view sVar16;
  const_iterator group;
  int size;
  int num_digits;
  wchar_t sep;
  string groups;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe98;
  locale_ref in_stack_fffffffffffffea0;
  locale_ref in_stack_fffffffffffffea8;
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff90;
  long lVar17;
  long lVar18;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 uVar19;
  undefined4 in_stack_ffffffffffffffb8;
  string local_28 [40];
  
  grouping<wchar_t>(in_stack_fffffffffffffea8);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    uVar19 = *(undefined8 *)(*in_RDI + 8);
    wVar6 = thousands_sep<wchar_t>(in_stack_fffffffffffffea0);
    if (wVar6 == L'\0') {
      on_dec(in_stack_ffffffffffffff60);
    }
    else {
      lVar17 = in_RDI[2];
      lVar18 = in_RDI[3];
      n._8_8_ = in_stack_fffffffffffffea8.locale_;
      n._0_8_ = in_stack_fffffffffffffea0.locale_;
      iVar7 = count_digits((uint128_t)n);
      iVar8 = iVar7;
      _Var11._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        uVar12 = std::__cxx11::string::cend();
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffea0.locale_,in_stack_fffffffffffffe98);
        bVar5 = false;
        if (bVar3) {
          iVar9 = iVar8;
          pcVar13 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&stack0xffffffffffffff88);
          bVar5 = false;
          bVar3 = *pcVar13 < iVar8;
          iVar8 = iVar9;
          if (bVar3) {
            pcVar13 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&stack0xffffffffffffff88);
            bVar5 = false;
            iVar8 = iVar9;
            if ('\0' < *pcVar13) {
              pcVar13 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&stack0xffffffffffffff88);
              cVar1 = *pcVar13;
              cVar4 = max_value<char>();
              bVar5 = cVar1 != cVar4;
              iVar8 = iVar9;
            }
          }
        }
        if (!bVar5) break;
        iVar7 = iVar7 + 1;
        pcVar13 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&stack0xffffffffffffff88);
        iVar8 = iVar8 - *pcVar13;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffff88);
      }
      uVar14 = std::__cxx11::string::cend();
      bVar5 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffea0.locale_,in_stack_fffffffffffffe98);
      if (bVar5) {
        iVar9 = iVar8 + -1;
        pcVar15 = (char *)std::__cxx11::string::back();
        iVar7 = iVar9 / (int)*pcVar15 + iVar7;
      }
      sVar16 = get_prefix((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *)
                          0x207d24);
      puVar2 = (undefined8 *)in_RDI[1];
      specs.type = (char)uVar14;
      specs._9_3_ = (int3)((ulong)uVar14 >> 8);
      specs.fill.data_[0] = (int)((ulong)uVar14 >> 0x20);
      specs.width = (int)sVar16.size_;
      specs.precision = (int)(sVar16.size_ >> 0x20);
      specs.fill.data_[1] = (int)uVar12;
      specs.fill.data_[2] = (int)((ulong)uVar12 >> 0x20);
      specs.fill._12_8_ = _Var11._M_current;
      f.abs_value._4_4_ = iVar7;
      f.abs_value._0_4_ = in_stack_ffffffffffffff90;
      f.abs_value._8_8_ = lVar17;
      f._16_8_ = lVar18;
      f.groups._0_4_ = in_stack_ffffffffffffffa8;
      f.groups._4_4_ = iVar8;
      f._32_8_ = uVar19;
      f._40_4_ = in_stack_ffffffffffffffb8;
      f._44_4_ = wVar6;
      basic_writer<fmt::v6::buffer_range<wchar_t>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)puVar2[1],
                 (int)((ulong)*puVar2 >> 0x20),*(string_view *)(puVar2 + 2),specs,f);
    }
  }
  else {
    on_dec(in_stack_ffffffffffffff60);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }